

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argumentHandlers.cpp
# Opt level: O0

error_t ArgumentHandlers::mmdp_method_parse_argument(int key,char *arg,argp_state *state)

{
  bool bVar1;
  ostream *poVar2;
  long in_RDX;
  allocator<char> *in_RSI;
  int in_EDI;
  string argString;
  Arguments *theArgumentsStruc;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  allocator<char> local_41;
  string local_40 [32];
  long local_20;
  int local_8;
  error_t local_4;
  
  local_20 = *(long *)(in_RDX + 0x28);
  if (in_RSI == (allocator<char> *)0x0) {
    in_RSI = (allocator<char> *)0xbdc1b2;
  }
  local_8 = in_EDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,
             (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),in_RSI);
  std::allocator<char>::~allocator(&local_41);
  if (local_8 == 0x74) {
    bVar1 = std::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (bVar1) {
      *(undefined4 *)(local_20 + 0x234) = 0;
    }
    else {
      bVar1 = std::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
      if (bVar1) {
        *(undefined4 *)(local_20 + 0x234) = 1;
      }
      else {
        bVar1 = std::operator==(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        if (!bVar1) {
          poVar2 = std::operator<<((ostream *)&std::cerr,"unkown mmdp_method \'");
          poVar2 = std::operator<<(poVar2,local_40);
          poVar2 = std::operator<<(poVar2,"\'");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          abort();
        }
        *(undefined4 *)(local_20 + 0x234) = 2;
      }
    }
    local_4 = 0;
  }
  else {
    local_4 = 7;
  }
  std::__cxx11::string::~string(local_40);
  return local_4;
}

Assistant:

error_t
mmdp_method_parse_argument (int key, char *arg, struct argp_state *state)
{
    /* Get the input argument from argp_parse, which we
      know is a pointer to our arguments structure. */
    struct Arguments *theArgumentsStruc = (struct Arguments*) state->input;
    std::string argString(arg ? arg : "");
    switch (key)
    {
        case 't': 
            if (argString=="ValueIteration")
                theArgumentsStruc->mmdp_method=ValueIteration;
            else if (argString=="PolicyIteration")
                theArgumentsStruc->mmdp_method=PolicyIteration;
            else if (argString=="PolicyIterationGPU")
                theArgumentsStruc->mmdp_method=PolicyIterationGPU;
            else
            {
                std::cerr<<"unkown mmdp_method '"<<argString<<"'"<<std::endl;
                abort();
            }
            break;
        default:
            return ARGP_ERR_UNKNOWN;
            break;
    }
    return 0;
}